

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::setEdWt(HDual *this,char *EdWt_ArgV)

{
  int iVar1;
  ostream *poVar2;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"Dan");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 4) = 2;
  }
  else {
    iVar1 = strcmp(in_RSI,"Dvx");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 4) = 1;
    }
    else {
      iVar1 = strcmp(in_RSI,"DSE");
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 4) = 0;
        *(undefined1 *)(in_RDI + 0x58) = 1;
      }
      else {
        iVar1 = strcmp(in_RSI,"DSE0");
        if (iVar1 == 0) {
          *(undefined4 *)(in_RDI + 4) = 0;
          *(undefined1 *)(in_RDI + 0x58) = 0;
        }
        else {
          iVar1 = strcmp(in_RSI,"DSE1");
          if (iVar1 == 0) {
            *(undefined4 *)(in_RDI + 4) = 0;
            *(undefined1 *)(in_RDI + 0x58) = 1;
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,"HDual::setEdWt unrecognised EdWtArgV = "
                                    );
            poVar2 = std::operator<<(poVar2,in_RSI);
            poVar2 = std::operator<<(poVar2," - using DSE with exact initial weights");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            *(undefined4 *)(in_RDI + 4) = 0;
            *(undefined1 *)(in_RDI + 0x58) = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HDual::setEdWt(const char *EdWt_ArgV) {
  //	cout<<"HDual::setEdWt EdWt_ArgV = "<<EdWt_ArgV<<endl;
	if (strcmp(EdWt_ArgV, "Dan") == 0)
		EdWt_Mode = EdWt_Mode_Dan;
	else if (strcmp(EdWt_ArgV, "Dvx") == 0)
		EdWt_Mode = EdWt_Mode_Dvx;
	else if (strcmp(EdWt_ArgV, "DSE") == 0)
		{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;}
	else if (strcmp(EdWt_ArgV, "DSE0") == 0)
		{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = false;}
	else if (strcmp(EdWt_ArgV, "DSE1") == 0)
	{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;}
	else {
	  cout << "HDual::setEdWt unrecognised EdWtArgV = " << EdWt_ArgV
	       << " - using DSE with exact initial weights" << endl;
	  EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;
	}
	//	cout<<"HDual::setEdWt iz_DSE_wt = " << iz_DSE_wt << endl;
}